

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_marker(stbi__jpeg *z,int m)

{
  stbi__context *psVar1;
  byte bVar2;
  byte bVar3;
  stbi_uc sVar4;
  stbi_uc sVar5;
  byte bVar6;
  sbyte sVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  int ok;
  uint uVar11;
  uint uVar12;
  int i_1;
  int iVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  int sizes [16];
  uint local_78 [18];
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      psVar1 = z->s;
      bVar2 = stbi__get8(psVar1);
      bVar3 = stbi__get8(psVar1);
      for (iVar13 = (uint)bVar3 + (uint)bVar2 * 0x100 + -2; 0 < iVar13;
          iVar13 = (iVar13 + -0x11) - uVar9) {
        bVar2 = stbi__get8(z->s);
        if ((0x1f < bVar2) || (bVar3 = bVar2 & 0xf, 3 < bVar3)) {
          stbi__g_failure_reason = "bad DHT header";
          goto LAB_00165297;
        }
        lVar14 = 0;
        uVar9 = 0;
        do {
          bVar6 = stbi__get8(z->s);
          local_78[lVar14] = (uint)bVar6;
          uVar9 = uVar9 + bVar6;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x10);
        if (bVar2 < 0x10) {
          iVar10 = stbi__build_huffman(z->huff_dc + bVar3,(int *)local_78);
          lVar14 = 8;
        }
        else {
          iVar10 = stbi__build_huffman(z->huff_ac + bVar3,(int *)local_78);
          lVar14 = 0x1a48;
        }
        if (iVar10 == 0) goto LAB_00165297;
        if (uVar9 != 0) {
          uVar15 = 0;
          do {
            sVar4 = stbi__get8(z->s);
            z->huff_dc[bVar3].values[uVar15 + lVar14 + -8] = sVar4;
            uVar15 = uVar15 + 1;
          } while (uVar9 != uVar15);
        }
        if (0xf < bVar2) {
          lVar14 = 0;
          do {
            uVar15 = (ulong)z->huff_ac[bVar3].fast[lVar14];
            z->fast_ac[bVar3][lVar14] = 0;
            if (uVar15 != 0xff) {
              bVar2 = z->huff_ac[bVar3].values[uVar15];
              if ((bVar2 & 0xf) != 0) {
                bVar6 = z->huff_ac[bVar3].size[uVar15];
                uVar8 = (bVar2 & 0xf) + (ushort)bVar6;
                if (uVar8 < 10) {
                  uVar12 = (int)lVar14 << (bVar6 & 0x1f) & 0x1ff;
                  sVar7 = (sbyte)(bVar2 & 0xf);
                  uVar11 = -1 << sVar7 | 1;
                  if (0xff < uVar12) {
                    uVar11 = 0;
                  }
                  iVar10 = uVar11 + (uVar12 >> (9U - sVar7 & 0x1f));
                  if ((char)iVar10 == iVar10) {
                    z->fast_ac[bVar3][lVar14] = (short)iVar10 * 0x100 | bVar2 & 0xfff0 | uVar8;
                  }
                }
              }
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x200);
        }
      }
    }
    else {
      if (m != 0xdb) {
LAB_00164ed7:
        if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
          psVar1 = z->s;
          sVar4 = stbi__get8(psVar1);
          sVar5 = stbi__get8(psVar1);
          uVar9 = (uint)CONCAT11(sVar4,sVar5);
          if (1 < uVar9) {
            if ((m == 0xe0) && (6 < uVar9)) {
              bVar16 = true;
              lVar14 = 0;
              do {
                sVar4 = stbi__get8(z->s);
                if (sVar4 != "JFIF"[lVar14]) {
                  bVar16 = false;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 5);
              iVar13 = uVar9 - 7;
              if (bVar16) {
                z->jfif = 1;
              }
            }
            else {
              iVar13 = uVar9 - 2;
              if ((m == 0xee) && (0xd < uVar9)) {
                bVar16 = true;
                lVar14 = 0;
                do {
                  sVar4 = stbi__get8(z->s);
                  if (sVar4 != "Adobe"[lVar14]) {
                    bVar16 = false;
                  }
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 6);
                if (bVar16) {
                  stbi__get8(z->s);
                  stbi__get16be(z->s);
                  stbi__get16be(z->s);
                  bVar2 = stbi__get8(z->s);
                  z->app14_color_transform = (uint)bVar2;
                  iVar13 = uVar9 - 0xe;
                }
                else {
                  iVar13 = uVar9 - 8;
                }
              }
            }
            stbi__skip(z->s,iVar13);
            goto LAB_001652ba;
          }
          if (m == 0xfe) {
            stbi__g_failure_reason = "bad COM len";
          }
          else {
            stbi__g_failure_reason = "bad APP len";
          }
        }
        else {
          stbi__g_failure_reason = "unknown marker";
        }
        goto LAB_00165297;
      }
      psVar1 = z->s;
      bVar2 = stbi__get8(psVar1);
      bVar3 = stbi__get8(psVar1);
      for (iVar13 = (uint)bVar3 + (uint)bVar2 * 0x100 + -2; 0 < iVar13;
          iVar13 = iVar13 + (uint)(bVar2 < 0x10) * 0x40 + -0x81) {
        bVar2 = stbi__get8(z->s);
        if ((bVar2 & 0xfffffff0) != 0x10 && 0xf < bVar2) {
          stbi__g_failure_reason = "bad DQT type";
          goto LAB_00165297;
        }
        uVar9 = bVar2 & 0xf;
        if (3 < uVar9) {
          stbi__g_failure_reason = "bad DQT table";
          goto LAB_00165297;
        }
        lVar14 = 0;
        do {
          psVar1 = z->s;
          bVar3 = stbi__get8(psVar1);
          uVar8 = (ushort)bVar3;
          if (0xf < bVar2) {
            sVar4 = stbi__get8(psVar1);
            uVar8 = CONCAT11(bVar3,sVar4);
          }
          *(ushort *)((long)z->dequant[0] + (ulong)""[lVar14] * 2 + (ulong)(uVar9 << 7)) = uVar8;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x40);
      }
    }
    bVar16 = iVar13 == 0;
  }
  else {
    if (m == 0xdd) {
      psVar1 = z->s;
      sVar4 = stbi__get8(psVar1);
      sVar5 = stbi__get8(psVar1);
      if (CONCAT11(sVar4,sVar5) == 4) {
        psVar1 = z->s;
        sVar4 = stbi__get8(psVar1);
        sVar5 = stbi__get8(psVar1);
        z->restart_interval = (uint)CONCAT11(sVar4,sVar5);
LAB_001652ba:
        bVar16 = true;
        goto LAB_00165299;
      }
      stbi__g_failure_reason = "bad DRI len";
    }
    else {
      if (m != 0xff) goto LAB_00164ed7;
      stbi__g_failure_reason = "expected marker";
    }
LAB_00165297:
    bVar16 = false;
  }
LAB_00165299:
  return (int)bVar16;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = sixteen ? stbi__get16be(z->s) : stbi__get8(z->s);
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}